

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

int __thiscall
deqp::gls::LongStressCaseInternal::Texture::getApproxMemUsageDiff
          (Texture *this,int width,int height,deUint32 internalFormat,bool useMipmap)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined7 in_register_00000081;
  int iVar7;
  int iVar8;
  TextureFormat local_28;
  
  iVar8 = 1;
  if ((int)CONCAT71(in_register_00000081,useMipmap) != 0) {
    uVar4 = height;
    if (height < width) {
      uVar4 = width;
    }
    uVar1 = 0x20;
    if (uVar4 != 0) {
      uVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar1 = uVar1 ^ 0x1f;
    }
    iVar8 = 0x20 - uVar1;
  }
  if (internalFormat - 0x1906 < 3) {
    iVar2 = *(int *)(&DAT_00b7cbe0 + (ulong)(internalFormat - 0x1906) * 4);
  }
  else {
    local_28 = glu::mapGLInternalFormat(internalFormat);
    iVar2 = tcu::TextureFormat::getPixelSize(&local_28);
  }
  if (iVar8 == 0) {
    iVar5 = 0;
  }
  else {
    iVar3 = 0;
    iVar5 = 0;
    do {
      iVar6 = width >> ((byte)iVar3 & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      iVar7 = height >> ((byte)iVar3 & 0x1f);
      if (iVar7 < 2) {
        iVar7 = 1;
      }
      iVar5 = iVar5 + iVar6 * ((uint)(this->m_type == TEXTURETYPE_CUBE) * 5 + 1) * iVar7 * iVar2;
      iVar3 = iVar3 + 1;
    } while (iVar8 != iVar3);
  }
  return iVar5 - this->m_dataSizeApprox;
}

Assistant:

int Texture::getApproxMemUsageDiff (const int width, const int height, const deUint32 internalFormat, const bool useMipmap) const
{
	const int	numLevels				= useMipmap ? deLog2Floor32(de::max(width, height))+1 : 1;
	const int	pixelSize				= internalFormat == GL_RGBA		? 4
										: internalFormat == GL_RGB		? 3
										: internalFormat == GL_ALPHA	? 1
										: glu::mapGLInternalFormat(internalFormat).getPixelSize();
	int			memUsageApproxAfter		= 0;

	for (int level = 0; level < numLevels; level++)
		memUsageApproxAfter += de::max(1, width>>level) * de::max(1, height>>level) * pixelSize * (m_type == TEXTURETYPE_CUBE ? 6 : 1);

	return memUsageApproxAfter - getApproxMemUsage();
}